

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O0

Expression * __thiscall slang::ast::ClassType::getBaseConstructorCall(ClassType *this)

{
  LookupLocation lookupLocation;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange range_00;
  SourceRange sourceRange_01;
  string_view arg_00;
  string_view arg_01;
  string_view arg_02;
  optional<slang::SourceRange> sourceRange_02;
  optional<slang::SourceRange> sourceRange_03;
  bool bVar1;
  SourceLocation *pSVar2;
  SyntaxNode *this_00;
  ClassDeclarationSyntax *pCVar3;
  SubroutineSymbol *pSVar4;
  Statement *this_01;
  reference ppSVar5;
  Expression *pEVar6;
  Symbol *in_RDI;
  Diagnostic *diag_3;
  FormalArgumentSymbol *arg;
  iterator __end3;
  iterator __begin3;
  ArgList *__range3;
  Diagnostic *diag_2;
  Diagnostic *diag_1;
  SourceRange range;
  ArgumentListSyntax *extendsArgs;
  Diagnostic *diag;
  SyntaxNode *argSyntax;
  ExtendsClauseSyntax *extendsClause;
  ASTContext context;
  Statement *stmt;
  iterator __end4;
  iterator __begin4;
  span<const_slang::ast::Statement_*const,_18446744073709551615UL> *__range4;
  Statement *body;
  anon_class_8_1_dd9b6ef1 checkForSuperNew;
  SubroutineSymbol *ourConstructor;
  bool constructorHasDefault;
  ClassDeclarationSyntax *classSyntax;
  SyntaxNode *syntax;
  Expression *callExpr;
  SubroutineSymbol *in_stack_fffffffffffffce8;
  Diagnostic *in_stack_fffffffffffffcf0;
  SourceLocation in_stack_fffffffffffffcf8;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffd00;
  DiagCode DVar7;
  SourceLocation in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd10;
  DiagCode in_stack_fffffffffffffd14;
  SourceLocation in_stack_fffffffffffffd18;
  Compilation *in_stack_fffffffffffffd20;
  DiagCode code;
  Diagnostic *in_stack_fffffffffffffd30;
  string_view *psVar8;
  SyntaxNode *in_stack_fffffffffffffd40;
  char *local_2b0;
  SourceLocation local_2a8;
  undefined1 in_stack_fffffffffffffd60 [16];
  SubroutineSymbol *local_290;
  Diagnostic *local_288;
  SubroutineSymbol *in_stack_fffffffffffffdb8;
  __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
  in_stack_fffffffffffffde8;
  ArgList local_210;
  ArgList *local_200;
  SourceRange local_1f8;
  undefined4 local_1e4;
  SourceLocation local_1e0;
  undefined4 local_1d4;
  SourceLocation local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  SourceRange local_1b8;
  undefined4 local_1a4;
  Diagnostic *local_1a0;
  SourceLocation local_198;
  SourceLocation local_190;
  SubroutineSymbol *local_188;
  SubroutineSymbol **local_148;
  Diagnostic *local_140;
  SourceLocation local_138;
  SourceRange local_130;
  ArgumentListSyntax *local_120;
  Token local_118;
  SourceLocation local_108;
  undefined4 local_fc;
  SourceLocation local_f8;
  SourceLocation local_f0;
  undefined4 local_e4;
  Diagnostic *local_e0;
  ArgumentListSyntax *local_d8;
  ExtendsClauseSyntax *local_d0;
  bitmask<slang::ast::ASTFlags> local_c8;
  LookupLocation local_c0;
  ArgumentListSyntax *in_stack_ffffffffffffff50;
  Expression *in_stack_ffffffffffffff58;
  Subroutine *in_stack_ffffffffffffff60;
  SourceLocation in_stack_ffffffffffffff68;
  SourceRange in_stack_ffffffffffffff70;
  iterator in_stack_ffffffffffffff90;
  iterator in_stack_ffffffffffffff98;
  Symbol *in_stack_ffffffffffffffb0;
  SourceLocation *in_stack_ffffffffffffffb8;
  bool local_31;
  SourceLocation local_20;
  Expression *local_18;
  SourceLocation local_8;
  
  bVar1 = std::optional::operator_cast_to_bool((optional<const_slang::ast::Expression_*> *)0x377508)
  ;
  if (bVar1) {
    pSVar2 = (SourceLocation *)
             std::optional<const_slang::ast::Expression_*>::operator*
                       ((optional<const_slang::ast::Expression_*> *)0x37751f);
    local_8 = *pSVar2;
  }
  else {
    local_18 = (Expression *)0x0;
    std::optional<slang::ast::Expression_const*>::operator=
              ((optional<const_slang::ast::Expression_*> *)in_stack_fffffffffffffcf0,
               (void **)in_stack_fffffffffffffce8);
    local_20 = (SourceLocation)0x0;
    this_00 = Symbol::getSyntax(in_RDI);
    pCVar3 = slang::syntax::SyntaxNode::as<slang::syntax::ClassDeclarationSyntax>(this_00);
    if (pCVar3->extendsClause == (ExtendsClauseSyntax *)0x0) {
      local_8 = (SourceLocation)0x0;
    }
    else {
      Scope::ensureElaborated((Scope *)in_stack_fffffffffffffcf0);
      bVar1 = Type::isError((Type *)0x3775cd);
      if (bVar1) {
        local_8 = (SourceLocation)0x0;
      }
      else {
        local_31 = false;
        pSVar4 = getConstructor((ClassType *)in_stack_fffffffffffffde8._M_current);
        if (pSVar4 != (SubroutineSymbol *)0x0) {
          in_stack_ffffffffffffffb8 = &local_20;
          in_stack_fffffffffffffd40 = (SyntaxNode *)&pSVar4->flags;
          bitmask<slang::ast::MethodFlags>::bitmask
                    ((bitmask<slang::ast::MethodFlags> *)&stack0xffffffffffffffb6,DefaultedSuperArg)
          ;
          local_31 = bitmask<slang::ast::MethodFlags>::has
                               ((bitmask<slang::ast::MethodFlags> *)in_stack_fffffffffffffcf0,
                                (bitmask<slang::ast::MethodFlags> *)in_stack_fffffffffffffce8);
          this_01 = SubroutineSymbol::getBody(in_stack_fffffffffffffdb8);
          bVar1 = Statement::bad(this_01);
          if (bVar1) {
            return (Expression *)0x0;
          }
          if (this_01->kind == List) {
            Statement::as<slang::ast::StatementList>(this_01);
            in_stack_ffffffffffffff98 =
                 std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>::begin
                           ((span<const_slang::ast::Statement_*const,_18446744073709551615UL> *)
                            in_stack_fffffffffffffce8);
            in_stack_ffffffffffffff90 =
                 std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>::end
                           ((span<const_slang::ast::Statement_*const,_18446744073709551615UL> *)
                            in_stack_fffffffffffffcf8);
            while (bVar1 = __gnu_cxx::
                           operator==<const_slang::ast::Statement_*const_*,_std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>_>
                                     ((__normal_iterator<const_slang::ast::Statement_*const_*,_std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>_>
                                       *)in_stack_fffffffffffffcf0,
                                      (__normal_iterator<const_slang::ast::Statement_*const_*,_std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>_>
                                       *)in_stack_fffffffffffffce8), ((bVar1 ^ 0xffU) & 1) != 0) {
              ppSVar5 = __gnu_cxx::
                        __normal_iterator<const_slang::ast::Statement_*const_*,_std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>_>
                        ::operator*((__normal_iterator<const_slang::ast::Statement_*const_*,_std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>_>
                                     *)&stack0xffffffffffffff98);
              if ((*ppSVar5)->kind != VariableDeclaration) {
                getBaseConstructorCall::anon_class_8_1_dd9b6ef1::operator()
                          ((anon_class_8_1_dd9b6ef1 *)in_stack_fffffffffffffd00.m_bits,
                           (Statement *)in_stack_fffffffffffffcf8);
                break;
              }
              __gnu_cxx::
              __normal_iterator<const_slang::ast::Statement_*const_*,_std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>_>
              ::operator++((__normal_iterator<const_slang::ast::Statement_*const_*,_std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>_>
                            *)&stack0xffffffffffffff98);
            }
          }
          else {
            getBaseConstructorCall::anon_class_8_1_dd9b6ef1::operator()
                      ((anon_class_8_1_dd9b6ef1 *)in_stack_fffffffffffffd00.m_bits,
                       (Statement *)in_stack_fffffffffffffcf8);
          }
        }
        psVar8 = &in_RDI[1].name;
        LookupLocation::LookupLocation
                  (&local_c0,(Scope *)&in_RDI[1].name,*(uint32_t *)&in_RDI[3].field_0x34);
        bitmask<slang::ast::ASTFlags>::bitmask(&local_c8,None);
        lookupLocation.index = in_stack_fffffffffffffd10;
        lookupLocation.scope = (Scope *)in_stack_fffffffffffffd08;
        lookupLocation._12_2_ = in_stack_fffffffffffffd14.subsystem;
        lookupLocation._14_2_ = in_stack_fffffffffffffd14.code;
        ASTContext::ASTContext
                  ((ASTContext *)in_stack_fffffffffffffcf8,(Scope *)in_stack_fffffffffffffcf0,
                   lookupLocation,in_stack_fffffffffffffd00);
        local_d0 = pCVar3->extendsClause;
        if ((local_20 == (SourceLocation)0x0) ||
           ((local_d0->arguments == (ArgumentListSyntax *)0x0 &&
            (local_d0->defaultedArg == (DefaultExtendsClauseArgSyntax *)0x0)))) {
          local_120 = local_d0->arguments;
          if (local_120 == (ArgumentListSyntax *)0x0) {
            if (local_d0->defaultedArg != (DefaultExtendsClauseArgSyntax *)0x0) {
              if (local_31 == false) {
                local_1d4 = 0x640007;
                local_1e0 = (pSVar4->super_Symbol).location;
                in_stack_fffffffffffffd08 =
                     (SourceLocation)
                     ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffd00.m_bits,
                                         in_stack_fffffffffffffd14,in_stack_fffffffffffffd08);
                local_1e4 = 0xc0001;
                local_1d0 = in_stack_fffffffffffffd08;
                local_1f8 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffd40);
                range_00.startLoc._4_2_ = in_stack_fffffffffffffd14.subsystem;
                range_00.startLoc._6_2_ = in_stack_fffffffffffffd14.code;
                range_00.startLoc._0_4_ = in_stack_fffffffffffffd10;
                range_00.endLoc = in_stack_fffffffffffffd18;
                Diagnostic::addNote((Diagnostic *)in_stack_fffffffffffffd08,
                                    SUB84((ulong)in_stack_fffffffffffffd20 >> 0x20,0),range_00);
              }
              local_31 = true;
            }
          }
          else if (in_RDI[2].parentScope == (Scope *)0x0) {
            bVar1 = slang::syntax::SeparatedSyntaxList<slang::syntax::ArgumentSyntax>::empty
                              ((SeparatedSyntaxList<slang::syntax::ArgumentSyntax> *)0x377a94);
            if (!bVar1) {
              local_1a4 = 0xa00007;
              local_1b8 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffd40);
              sourceRange_00.startLoc._4_2_ = in_stack_fffffffffffffd14.subsystem;
              sourceRange_00.startLoc._6_2_ = in_stack_fffffffffffffd14.code;
              sourceRange_00.startLoc._0_4_ = in_stack_fffffffffffffd10;
              sourceRange_00.endLoc = in_stack_fffffffffffffd18;
              local_1a0 = ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffd08,
                                              SUB84((ulong)in_stack_fffffffffffffd20 >> 0x20,0),
                                              sourceRange_00);
              local_1c8 = *(undefined8 *)((long)in_RDI[2].location + 8);
              local_1c0 = *(undefined8 *)((long)in_RDI[2].location + 0x10);
              arg_00._M_str = (char *)in_stack_fffffffffffffd40;
              arg_00._M_len = (size_t)psVar8;
              Diagnostic::operator<<(in_stack_fffffffffffffd30,arg_00);
              Diagnostic::operator<<<int>
                        ((Diagnostic *)in_stack_fffffffffffffd00.m_bits,
                         in_stack_fffffffffffffcf8._4_4_);
              in_stack_fffffffffffffd10 = SUB84(local_1a0,0);
              in_stack_fffffffffffffd14 = SUB84((ulong)local_1a0 >> 0x20,0);
              slang::syntax::SeparatedSyntaxList<slang::syntax::ArgumentSyntax>::size
                        ((SeparatedSyntaxList<slang::syntax::ArgumentSyntax> *)0x377b63);
              Diagnostic::operator<<<unsigned_long>
                        ((Diagnostic *)in_stack_fffffffffffffd00.m_bits,
                         (unsigned_long)in_stack_fffffffffffffcf8);
            }
          }
          else {
            local_130 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffd40);
            in_stack_fffffffffffffd18 = (SourceLocation)in_RDI[2].parentScope;
            std::optional<slang::SourceRange>::optional<slang::SourceRange_&,_true>
                      ((optional<slang::SourceRange> *)in_stack_fffffffffffffcf0,
                       (SourceRange *)in_stack_fffffffffffffce8);
            sourceRange_02.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
            super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc =
                 (SourceLocation)in_stack_ffffffffffffffb8;
            sourceRange_02.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
            super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc =
                 (SourceLocation)in_stack_ffffffffffffffb0;
            sourceRange_02.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
            super__Optional_payload_base<slang::SourceRange>._16_8_ = pSVar4;
            Lookup::ensureVisible
                      ((Symbol *)in_stack_ffffffffffffff98._M_current,
                       (ASTContext *)in_stack_ffffffffffffff90._M_current,sourceRange_02);
            in_stack_fffffffffffffd20 = ASTContext::getCompilation((ASTContext *)0x3779e6);
            local_188 = Symbol::as<slang::ast::SubroutineSymbol>((Symbol *)0x3779ff);
            std::
            variant<slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
            ::
            variant<slang::ast::SubroutineSymbol_const*,void,void,slang::ast::SubroutineSymbol_const*,void>
                      ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        *)local_140,local_148);
            local_198 = local_130.startLoc;
            local_190 = local_130.endLoc;
            in_stack_fffffffffffffce8 = (SubroutineSymbol *)&stack0xffffffffffffff50;
            local_20 = (SourceLocation)
                       CallExpression::fromArgs
                                 ((Compilation *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60
                                  ,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                                  in_stack_ffffffffffffff70,
                                  (ASTContext *)in_stack_ffffffffffffff90._M_current);
            in_stack_fffffffffffffcf0 = local_140;
            in_stack_fffffffffffffcf8 = local_138;
          }
          if (((in_RDI[2].parentScope != (Scope *)0x0) && (local_20 == (SourceLocation)0x0)) &&
             (local_31 == false)) {
            Symbol::as<slang::ast::SubroutineSymbol>((Symbol *)0x377c88);
            local_210 = SubroutineSymbol::getArguments(in_stack_fffffffffffffce8);
            local_200 = &local_210;
            std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::begin
                      ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>
                        *)in_stack_fffffffffffffce8);
            std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::end
                      ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>
                        *)in_stack_fffffffffffffcf8);
            while (bVar1 = __gnu_cxx::
                           operator==<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                                     ((__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                                       *)in_stack_fffffffffffffcf0,
                                      (__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                                       *)in_stack_fffffffffffffce8), ((bVar1 ^ 0xffU) & 1) != 0) {
              __gnu_cxx::
              __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
              ::operator*((__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                           *)&stack0xfffffffffffffde8);
              pEVar6 = FormalArgumentSymbol::getDefaultValue(in_stack_fffffffffffffd60._8_8_);
              code = SUB84((ulong)in_stack_fffffffffffffd20 >> 0x20,0);
              DVar7 = SUB84(in_stack_fffffffffffffd00.m_bits >> 0x20,0);
              if (pEVar6 == (Expression *)0x0) {
                slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffd40);
                sourceRange_01.startLoc._4_2_ = in_stack_fffffffffffffd14.subsystem;
                sourceRange_01.startLoc._6_2_ = in_stack_fffffffffffffd14.code;
                sourceRange_01.startLoc._0_4_ = in_stack_fffffffffffffd10;
                sourceRange_01.endLoc = in_stack_fffffffffffffd18;
                ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffd08,code,sourceRange_01);
                arg_01._M_str = (char *)in_stack_fffffffffffffd40;
                arg_01._M_len = (size_t)psVar8;
                Diagnostic::operator<<(in_stack_fffffffffffffd30,arg_01);
                arg_02._M_str = (char *)in_stack_fffffffffffffd40;
                arg_02._M_len = (size_t)psVar8;
                Diagnostic::operator<<(in_stack_fffffffffffffd30,arg_02);
                Diagnostic::addNote(in_stack_fffffffffffffcf0,DVar7,in_stack_fffffffffffffcf8);
                return (Expression *)0x0;
              }
              __gnu_cxx::
              __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
              ::operator++((__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                            *)&stack0xfffffffffffffde8);
            }
            slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffd40);
            std::optional<slang::SourceRange>::optional<slang::SourceRange,_true>
                      ((optional<slang::SourceRange> *)in_stack_fffffffffffffcf0,
                       (SourceRange *)in_stack_fffffffffffffce8);
            sourceRange_03.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
            super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc =
                 (SourceLocation)in_stack_ffffffffffffffb8;
            sourceRange_03.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
            super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc =
                 (SourceLocation)in_stack_ffffffffffffffb0;
            sourceRange_03.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
            super__Optional_payload_base<slang::SourceRange>._16_8_ = pSVar4;
            Lookup::ensureVisible
                      ((Symbol *)in_stack_ffffffffffffff98._M_current,
                       (ASTContext *)in_stack_ffffffffffffff90._M_current,sourceRange_03);
            in_stack_fffffffffffffce8 = local_290;
            in_stack_fffffffffffffcf0 = local_288;
          }
          std::optional<const_slang::ast::Expression_*>::
          optional<const_slang::ast::Expression_*&,_true>
                    ((optional<const_slang::ast::Expression_*> *)in_stack_fffffffffffffcf0,
                     (Expression **)in_stack_fffffffffffffce8);
          in_RDI[3].name._M_str = local_2b0;
          in_RDI[3].location = local_2a8;
          local_8 = local_20;
        }
        else {
          if (local_d0->arguments == (ArgumentListSyntax *)0x0) {
            local_d8 = (ArgumentListSyntax *)local_d0->defaultedArg;
          }
          else {
            local_d8 = local_d0->arguments;
          }
          local_e4 = 0x70006;
          local_f8 = ((SourceRange *)((long)local_20 + 0x20))->startLoc;
          local_f0 = *(SourceLocation *)((long)local_20 + 0x28);
          sourceRange.startLoc._4_2_ = in_stack_fffffffffffffd14.subsystem;
          sourceRange.startLoc._6_2_ = in_stack_fffffffffffffd14.code;
          sourceRange.startLoc._0_4_ = in_stack_fffffffffffffd10;
          sourceRange.endLoc = in_stack_fffffffffffffd18;
          local_e0 = ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffd08,
                                         SUB84((ulong)in_stack_fffffffffffffd20 >> 0x20,0),
                                         sourceRange);
          DVar7 = SUB84(in_stack_fffffffffffffd00.m_bits >> 0x20,0);
          local_fc = 0xc0001;
          local_118 = slang::syntax::SyntaxNode::getFirstToken
                                ((SyntaxNode *)in_stack_fffffffffffffd20);
          local_108 = parsing::Token::location(&local_118);
          Diagnostic::addNote(in_stack_fffffffffffffcf0,DVar7,in_stack_fffffffffffffcf8);
          local_8 = (SourceLocation)0x0;
        }
      }
    }
  }
  return (Expression *)local_8;
}

Assistant:

const Expression* ClassType::getBaseConstructorCall() const {
    if (baseConstructorCall)
        return *baseConstructorCall;

    baseConstructorCall = nullptr;
    const Expression* callExpr = nullptr;

    auto syntax = getSyntax();
    SLANG_ASSERT(syntax);

    auto& classSyntax = syntax->as<ClassDeclarationSyntax>();
    if (!classSyntax.extendsClause)
        return nullptr;

    ensureElaborated();

    SLANG_ASSERT(baseClass);
    if (baseClass->isError())
        return nullptr;

    // If we have a constructor, find whether it invokes super.new in its body.
    bool constructorHasDefault = false;
    auto ourConstructor = getConstructor();
    if (ourConstructor) {
        auto checkForSuperNew = [&](const Statement& stmt) {
            if (stmt.kind == StatementKind::ExpressionStatement) {
                auto& expr = stmt.as<ExpressionStatement>().expr;
                if (expr.kind == ExpressionKind::NewClass &&
                    expr.as<NewClassExpression>().isSuperClass) {
                    callExpr = &expr;
                }
            }
        };

        // If the body is invalid, early out now so we don't report
        // spurious errors on top of it.
        constructorHasDefault = ourConstructor->flags.has(MethodFlags::DefaultedSuperArg);
        auto& body = ourConstructor->getBody();
        if (body.bad())
            return nullptr;

        if (body.kind != StatementKind::List) {
            checkForSuperNew(body);
        }
        else {
            for (auto stmt : body.as<StatementList>().list) {
                if (stmt->kind != StatementKind::VariableDeclaration) {
                    checkForSuperNew(*stmt);
                    break;
                }
            }
        }
    }

    ASTContext context(*this, LookupLocation(this, uint32_t(headerIndex)));
    auto& extendsClause = *classSyntax.extendsClause;

    // Can't have both a super.new and extends arguments.
    if (callExpr && (extendsClause.arguments || extendsClause.defaultedArg)) {
        auto argSyntax = extendsClause.arguments ? (const SyntaxNode*)extendsClause.arguments
                                                 : extendsClause.defaultedArg;
        auto& diag = context.addDiag(diag::BaseConstructorDuplicate, callExpr->sourceRange);
        diag.addNote(diag::NotePreviousUsage, argSyntax->getFirstToken().location());
        return nullptr;
    }

    if (auto extendsArgs = extendsClause.arguments) {
        // If we have a base class constructor, create the call to it.
        if (baseConstructor) {
            SourceRange range = extendsClause.sourceRange();
            Lookup::ensureVisible(*baseConstructor, context, range);

            callExpr = &CallExpression::fromArgs(context.getCompilation(),
                                                 &baseConstructor->as<SubroutineSymbol>(), nullptr,
                                                 extendsArgs, range, context);
        }
        else if (!extendsArgs->parameters.empty()) {
            auto& diag = context.addDiag(diag::TooManyArguments, extendsArgs->sourceRange());
            diag << baseClass->name;
            diag << 0;
            diag << extendsArgs->parameters.size();
        }
    }
    else if (extendsClause.defaultedArg) {
        SLANG_ASSERT(ourConstructor);
        if (!constructorHasDefault) {
            auto& diag = context.addDiag(diag::InvalidExtendsDefault, ourConstructor->location);
            diag.addNote(diag::NotePreviousUsage, extendsClause.defaultedArg->sourceRange());
        }

        constructorHasDefault = true;
    }

    // If we have a base class constructor and nothing called it, make sure
    // it has no arguments or all of the arguments have default values.
    // If our own constructor declares a 'default' arg then this requirement
    // is removed since we will insert the appropriate call arguments automatically.
    if (baseConstructor && !callExpr && !constructorHasDefault) {
        for (auto arg : baseConstructor->as<SubroutineSymbol>().getArguments()) {
            if (!arg->getDefaultValue()) {
                auto& diag = context.addDiag(diag::BaseConstructorNotCalled,
                                             extendsClause.sourceRange());
                diag << name << baseClass->name;
                diag.addNote(diag::NoteDeclarationHere, baseConstructor->location);
                return nullptr;
            }
        }

        Lookup::ensureVisible(*baseConstructor, context, extendsClause.sourceRange());
    }

    baseConstructorCall = callExpr;
    return callExpr;
}